

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O3

int __thiscall Fl_Window_Type::handle(Fl_Window_Type *this,int event)

{
  uint uVar1;
  int iVar2;
  Fl_Group *pFVar3;
  Fl_Type *pFVar4;
  int iVar5;
  int iVar6;
  Fl_Type *pFVar7;
  Fl_Menu_Item *pFVar8;
  int t_1;
  uint uVar9;
  fd_set *pfVar10;
  fd_set *__exceptfds;
  int t;
  uint uVar11;
  fd_set *extraout_RDX;
  fd_set *__writefds;
  fd_set *__writefds_00;
  fd_set *extraout_RDX_00;
  fd_set *extraout_RDX_01;
  fd_set *extraout_RDX_02;
  fd_set *__writefds_01;
  char *__file;
  ulong uVar12;
  fd_set *pfVar13;
  Fl_Window_Type *pFVar14;
  timeval *in_R8;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  Fl_Widget_Type *myo;
  Fl_Window_Type *pFVar19;
  Fl_Window_Type *pFVar20;
  undefined4 extraout_var;
  
  iVar6 = Fl::e_state;
  iVar5 = Fl::e_x;
  uVar11 = 0;
  __file = (char *)(ulong)(event - 1U);
  if (0xb < event - 1U) {
    return 0;
  }
  pfVar10 = (fd_set *)
            ((long)&switchD_0018c7a8::switchdataD_002141d8 +
            (long)(int)(&switchD_0018c7a8::switchdataD_002141d8)[(long)__file]);
  switch(__file) {
  case (char *)0x0:
    this->mx = Fl::e_x;
    this->x1 = iVar5;
    iVar6 = Fl::e_y;
    this->my = Fl::e_y;
    this->y1 = iVar6;
    this->dx = 0;
    this->dy = 0;
    this->drag = 0;
    if (0xfeea < Fl::e_keysym) {
      in_this_only = (Fl_Type *)this;
      pFVar8 = Fl_Menu_Item::popup(New_Menu,iVar5,iVar6,"New",handle::myprev,(Fl_Menu_ *)0x0);
      if ((pFVar8 != (Fl_Menu_Item *)0x0) && (pFVar8->callback_ != (Fl_Callback *)0x0)) {
        handle::myprev = pFVar8;
        (*pFVar8->callback_)((this->super_Fl_Widget_Type).o,pFVar8->user_data_);
      }
      in_this_only = (Fl_Type *)0x0;
      break;
    }
    handle::selection = (Fl_Type *)this;
    for (pFVar7 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
        (pFVar7 != (Fl_Type *)0x0 &&
        ((this->super_Fl_Widget_Type).super_Fl_Type.level < pFVar7->level)); pFVar7 = pFVar7->next)
    {
      iVar5 = (*pFVar7->_vptr_Fl_Type[0x17])(pFVar7);
      if ((iVar5 != 0) && (iVar5 = (*pFVar7->_vptr_Fl_Type[0x1e])(pFVar7), iVar5 == 0)) {
        for (pFVar3 = (Fl_Group *)pFVar7[1].prev; pFVar3 != (Fl_Group *)0x0;
            pFVar3 = (pFVar3->super_Fl_Widget).parent_) {
          if (((pFVar3->super_Fl_Widget).flags_ & 2) != 0) goto LAB_0018c9bd;
        }
        iVar5 = Fl::event_inside((Fl_Widget *)pFVar7[1].prev);
        if ((iVar5 != 0) && (handle::selection = pFVar7, Fl::e_clicks == 1)) {
          reveal_in_browser(pFVar7);
        }
      }
LAB_0018c9bd:
    }
    if (this->numselected == 0) {
      uVar12 = (ulong)(uint)this->mx;
    }
    else {
      uVar11 = this->mx;
      uVar12 = (ulong)uVar11;
      if (((Fl::e_state & 0x10000U) == 0) && (iVar5 = this->br, (int)uVar11 <= snap + iVar5)) {
        uVar9 = this->bx;
        in_R8 = (timeval *)(ulong)uVar9;
        if ((int)(uVar9 - snap) <= (int)uVar11) {
          iVar6 = this->my;
          uVar1 = this->bt;
          pfVar10 = (fd_set *)(ulong)uVar1;
          if ((iVar6 <= (int)(uVar1 + snap)) && (iVar2 = this->by, iVar2 - snap <= iVar6)) {
            iVar15 = 5;
            if (5 < snap) {
              iVar15 = snap;
            }
            iVar17 = iVar5 - uVar9;
            iVar16 = iVar17 + 3;
            if (-1 < iVar17) {
              iVar16 = iVar17;
            }
            iVar17 = iVar16 >> 2;
            if (iVar15 <= iVar16 >> 2) {
              iVar17 = iVar15;
            }
            uVar18 = 2;
            if ((iVar5 - iVar17 <= (int)uVar11) || (uVar18 = 1, (int)uVar11 < (int)(iVar17 + uVar9))
               ) {
              this->drag = this->drag | uVar18;
            }
            uVar9 = uVar1 - iVar2;
            in_R8 = (timeval *)(ulong)uVar9;
            uVar11 = uVar9 + 3;
            if (-1 < (int)uVar9) {
              uVar11 = uVar9;
            }
            iVar5 = (int)uVar11 >> 2;
            if (iVar15 <= (int)uVar11 >> 2) {
              iVar5 = iVar15;
            }
            if (iVar2 + iVar5 < iVar6) {
              pfVar10 = (fd_set *)(ulong)(uVar1 - iVar5);
              if ((int)(uVar1 - iVar5) < iVar6) {
                this->drag = this->drag | 4;
              }
              else if (this->drag == 0) {
                this->drag = 0x10;
              }
            }
            else {
              *(byte *)&this->drag = (byte)this->drag | 8;
            }
          }
        }
      }
    }
    iVar5 = (*handle::selection->_vptr_Fl_Type[7])(handle::selection,uVar12,(ulong)(uint)this->my);
    pFVar7 = (Fl_Type *)CONCAT44(extraout_var,iVar5);
    if (pFVar7 == (Fl_Type *)0x0) {
      if (this->drag != 0) {
        return 1;
      }
      this->drag = 0x20;
      return 1;
    }
    if ((Fl::e_state & 0x10000U) == 0) {
      deselect();
      select(iVar5,(fd_set *)&DAT_00000001,__writefds_00,pfVar10,in_R8);
      iVar5 = (*pFVar7->_vptr_Fl_Type[0x1e])(pFVar7);
      if (iVar5 != 0) {
        (*pFVar7->_vptr_Fl_Type[0xb])(pFVar7);
      }
    }
    else {
      Fl::e_is_click = 0;
      select(iVar5,(fd_set *)(ulong)(pFVar7->selected == '\0'),__writefds,pfVar10,in_R8);
    }
    goto LAB_0018ccc4;
  case (char *)0x1:
    if (this->drag == 0) {
      return 0;
    }
    this->mx = Fl::e_x;
    iVar6 = Fl::e_y;
    this->my = Fl::e_y;
    iVar2 = Fl::e_state;
    if (this->drag == 0x20) {
LAB_0018c8dc:
      iVar15 = 0x2a078c;
      if ((Fl::e_clicks == 0) && (iVar15 = 0x2a0788, ((uint)Fl::e_state >> 0x12 & 1) == 0)) {
        uVar11 = this->x1;
        pfVar10 = (fd_set *)(ulong)uVar11;
        if (iVar5 < (int)uVar11) {
          this->x1 = iVar5;
          this->mx = uVar11;
        }
        uVar11 = this->y1;
        __exceptfds = (fd_set *)(ulong)uVar11;
        if (iVar6 < (int)uVar11) {
          this->y1 = iVar6;
          this->my = uVar11;
        }
        if (((uint)iVar2 >> 0x10 & 1) == 0) {
          deselect();
          pfVar10 = extraout_RDX;
        }
        else {
          Fl::e_is_click = 0;
        }
        pFVar7 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
        if (pFVar7 != (Fl_Type *)0x0) {
          iVar5 = 0;
          do {
            if (pFVar7->level <= (this->super_Fl_Widget_Type).super_Fl_Type.level) break;
            iVar6 = (*pFVar7->_vptr_Fl_Type[0x17])(pFVar7);
            pfVar10 = extraout_RDX_00;
            if ((iVar6 != 0) &&
               (iVar6 = (*pFVar7->_vptr_Fl_Type[0x1e])(pFVar7), pfVar10 = extraout_RDX_01,
               iVar6 == 0)) {
              for (pFVar3 = (Fl_Group *)pFVar7[1].prev; pFVar3 != (Fl_Group *)0x0;
                  pFVar3 = (pFVar3->super_Fl_Widget).parent_) {
                if (((pFVar3->super_Fl_Widget).flags_ & 2) != 0) goto LAB_0018cd6c;
              }
              iVar6 = Fl::event_inside((Fl_Widget *)pFVar7[1].prev);
              if (iVar6 != 0) {
                handle::selection = pFVar7;
              }
              pFVar4 = pFVar7[1].prev;
              uVar11 = *(uint *)&pFVar4->user_data_;
              pfVar10 = (fd_set *)(ulong)uVar11;
              if (this->x1 <= (int)uVar11) {
                uVar9 = *(uint *)((long)&pFVar4->user_data_ + 4);
                __exceptfds = (fd_set *)(ulong)uVar9;
                if (((this->y1 < (int)uVar9) &&
                    (uVar11 = uVar11 + *(int *)&pFVar4->user_data_type_,
                    pfVar10 = (fd_set *)(ulong)uVar11, (int)uVar11 < this->mx)) &&
                   (uVar9 = uVar9 + *(int *)((long)&pFVar4->user_data_type_ + 4),
                   __exceptfds = (fd_set *)(ulong)uVar9, (int)uVar9 < this->my)) {
                  pfVar13 = (fd_set *)&DAT_00000001;
                  if (((uint)iVar2 >> 0x10 & 1) != 0) {
                    pfVar13 = (fd_set *)(ulong)(pFVar7->selected == '\0');
                  }
                  iVar5 = iVar5 + 1;
                  select((int)pFVar7,pfVar13,pfVar10,__exceptfds,in_R8);
                  pfVar10 = extraout_RDX_02;
                }
              }
            }
LAB_0018cd6c:
            pFVar7 = pFVar7->next;
          } while (pFVar7 != (Fl_Type *)0x0);
          if (iVar5 != 0) goto LAB_0018ce27;
        }
        pfVar13 = (fd_set *)&DAT_00000001;
        if (((uint)iVar2 >> 0x10 & 1) != 0) {
          pfVar13 = (fd_set *)(ulong)(handle::selection->selected == '\0');
        }
        select((int)handle::selection,pfVar13,pfVar10,__exceptfds,in_R8);
      }
      else {
        Fl_Widget_Type::open(&this->super_Fl_Widget_Type,__file,iVar15);
      }
    }
    else if (this->dy == 0 && this->dx == 0) {
      if (Fl::e_is_click != 0) goto LAB_0018c8dc;
    }
    else {
      moveallchildren(this);
    }
LAB_0018ce27:
    this->drag = 0;
    Fl_Overlay_Window::redraw_overlay((Fl_Overlay_Window *)(this->super_Fl_Widget_Type).o);
    break;
  default:
    goto switchD_0018c7a8_caseD_2;
  case (char *)0x4:
    if (this->drag == 0) {
      return 0;
    }
    this->mx = Fl::e_x;
    this->my = Fl::e_y;
    newdx(this);
    break;
  case (char *)0x7:
    uVar11 = 0;
    iVar5 = 0;
    if (Fl::e_keysym < 0xff51) {
      if (Fl::e_keysym == 0x6f) {
        toggle_overlays((Fl_Widget *)this,__file);
        goto switchD_0018c7a8_caseD_b;
      }
      if (Fl::e_keysym == 0xff09) {
        pFVar19 = (Fl_Window_Type *)Fl_Type::current;
        if (Fl_Type::current == (Fl_Type *)0x0) {
          return 0;
        }
        while ((iVar5 = (*(pFVar19->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])
                                  (pFVar19), iVar5 == 0 ||
               (iVar5 = (*(pFVar19->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x1e])
                                  (pFVar19), pFVar14 = pFVar19, iVar5 != 0))) {
          pFVar19 = (Fl_Window_Type *)(pFVar19->super_Fl_Widget_Type).super_Fl_Type.parent;
          if (pFVar19 == (Fl_Window_Type *)0x0) {
            return 0;
          }
        }
        do {
          pFVar14 = (Fl_Window_Type *)(pFVar14->super_Fl_Widget_Type).super_Fl_Type.parent;
          if (pFVar14 == (Fl_Window_Type *)0x0) break;
        } while (pFVar14 != this);
        if ((pFVar14 == (Fl_Window_Type *)0x0) ||
           (iVar5 = (*(pFVar14->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(),
           iVar5 == 0)) {
          pFVar19 = (Fl_Window_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
          if (pFVar19 == (Fl_Window_Type *)0x0) {
            return 0;
          }
          if ((pFVar19->super_Fl_Widget_Type).super_Fl_Type.level <=
              (this->super_Fl_Widget_Type).super_Fl_Type.level) {
            return 0;
          }
        }
        uVar12 = (ulong)((uint)iVar6 >> 0xd & 8);
        pFVar14 = *(Fl_Window_Type **)
                   ((long)(pFVar19->super_Fl_Widget_Type).extra_code_ + (uVar12 - 0x28));
        pFVar20 = pFVar19;
        if (pFVar14 != (Fl_Window_Type *)0x0) {
          while (pFVar20 = pFVar19,
                (this->super_Fl_Widget_Type).super_Fl_Type.level <
                (pFVar14->super_Fl_Widget_Type).super_Fl_Type.level) {
            iVar5 = (*(pFVar14->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(pFVar14);
            if (((iVar5 != 0) &&
                (iVar5 = (*(pFVar14->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x1e])
                                   (pFVar14), pFVar20 = pFVar14, iVar5 == 0)) ||
               (pFVar14 = *(Fl_Window_Type **)
                           ((long)(pFVar14->super_Fl_Widget_Type).extra_code_ +
                           ((uVar12 | 0x50) - 0x78)), pFVar20 = pFVar19,
               pFVar14 == (Fl_Window_Type *)0x0)) break;
          }
        }
        deselect();
        select((int)pFVar20,(fd_set *)&DAT_00000001,__writefds_01,pfVar10,in_R8);
        return 1;
      }
      if (Fl::e_keysym != 0xff1b) {
        return 0;
      }
      (*((this->super_Fl_Widget_Type).o)->_vptr_Fl_Widget[6])();
      break;
    }
    switch(Fl::e_keysym) {
    case 0xff51:
      iVar6 = -1;
      break;
    case 0xff52:
      iVar5 = -1;
      goto LAB_0018cc68;
    case 0xff53:
      iVar6 = 1;
      break;
    case 0xff54:
      iVar5 = 1;
LAB_0018cc68:
      iVar6 = 0;
      break;
    default:
      goto switchD_0018c7a8_caseD_2;
    }
    this->dx = iVar6;
    this->dy = iVar5;
    iVar2 = Fl::e_state;
    iVar15 = 10;
    if (((uint)Fl::e_state >> 0x10 & 1) == 0) {
      iVar15 = 0x10;
    }
    this->drag = iVar15;
    if (((uint)iVar2 >> 0x12 & 1) != 0) {
      this->dx = iVar6 * gridx;
      this->dy = iVar5 * gridy;
    }
    moveallchildren(this);
    pFVar7 = handle::selection;
LAB_0018ccc4:
    handle::selection = pFVar7;
    this->drag = 0;
    break;
  case (char *)0xb:
switchD_0018c7a8_caseD_b:
    in_this_only = (Fl_Type *)this;
    pFVar8 = Fl_Menu_Item::test_shortcut(Main_Menu);
    if ((pFVar8 != (Fl_Menu_Item *)0x0) && (pFVar8->callback_ != (Fl_Callback *)0x0)) {
      (*pFVar8->callback_)((this->super_Fl_Widget_Type).o,pFVar8->user_data_);
    }
    uVar11 = (uint)(pFVar8 != (Fl_Menu_Item *)0x0);
    in_this_only = (Fl_Type *)0x0;
    goto switchD_0018c7a8_caseD_2;
  }
  uVar11 = 1;
switchD_0018c7a8_caseD_2:
  return uVar11;
}

Assistant:

int Fl_Window_Type::handle(int event) {
  static Fl_Type* selection;
  switch (event) {
  case FL_PUSH:
    x1 = mx = Fl::event_x();
    y1 = my = Fl::event_y();
    drag = dx = dy = 0;
    // test for popup menu:
    if (Fl::event_button() >= 3) {
      in_this_only = this; // modifies how some menu items work.
      static const Fl_Menu_Item* myprev;
      const Fl_Menu_Item* m = New_Menu->popup(mx,my,"New",myprev);
      if (m && m->callback()) {myprev = m; m->do_callback(this->o);}
      in_this_only = 0;
      return 1;
    }
    // find the innermost item clicked on:
    selection = this;
    {for (Fl_Type* i=next; i && i->level>level; i=i->next)
      if (i->is_widget() && !i->is_menu_item()) {
      Fl_Widget_Type* myo = (Fl_Widget_Type*)i;
      for (Fl_Widget *o1 = myo->o; o1; o1 = o1->parent())
	if (!o1->visible()) goto CONTINUE2;
      if (Fl::event_inside(myo->o)) {
        selection = myo;
        if (Fl::event_clicks()==1)
          reveal_in_browser(myo);
      }
    CONTINUE2:;
    }}
    // see if user grabs edges of selected region:
    if (numselected && !(Fl::event_state(FL_SHIFT)) &&
	mx<=br+snap && mx>=bx-snap && my<=bt+snap && my>=by-snap) {
      int snap1 = snap>5 ? snap : 5;
      int w1 = (br-bx)/4; if (w1 > snap1) w1 = snap1;
      if (mx>=br-w1) drag |= RIGHT;
      else if (mx<bx+w1) drag |= LEFT;
      w1 = (bt-by)/4; if (w1 > snap1) w1 = snap1;
      if (my<=by+w1) drag |= TOP;
      else if (my>bt-w1) drag |= BOTTOM;
      if (!drag) drag = DRAG;
    }
    // do object-specific selection of other objects:
    {Fl_Type* t = selection->click_test(mx, my);
    if (t) {
      //if (t == selection) return 1; // indicates mouse eaten w/o change
      if (Fl::event_state(FL_SHIFT)) {
	Fl::event_is_click(0);
	select(t, !t->selected);
      } else {
	deselect();
	select(t, 1);
	if (t->is_menu_item()) t->open();
      }
      selection = t;
      drag = 0;
    } else {
      if (!drag) drag = BOX; // if all else fails, start a new selection region
    }}
    return 1;

  case FL_DRAG:
    if (!drag) return 0;
    mx = Fl::event_x();
    my = Fl::event_y();
    newdx();
    return 1;

  case FL_RELEASE:
    if (!drag) return 0;
    mx = Fl::event_x();
    my = Fl::event_y();
    if (drag != BOX && (dx || dy || !Fl::event_is_click())) {
      if (dx || dy) moveallchildren();
    } else if ((Fl::event_clicks() || Fl::event_state(FL_CTRL))) {
      Fl_Widget_Type::open();
    } else {
      if (mx<x1) {int t = x1; x1 = mx; mx = t;}
      if (my<y1) {int t = y1; y1 = my; my = t;}
      int n = 0;
      int toggle = Fl::event_state(FL_SHIFT);
      // clear selection on everything:
      if (!toggle) deselect(); else Fl::event_is_click(0);
      // select everything in box:
      for (Fl_Type*i=next; i&&i->level>level; i=i->next)
	if (i->is_widget() && !i->is_menu_item()) {
	Fl_Widget_Type* myo = (Fl_Widget_Type*)i;
	for (Fl_Widget *o1 = myo->o; o1; o1 = o1->parent())
	  if (!o1->visible()) goto CONTINUE;
	if (Fl::event_inside(myo->o)) selection = myo;
	if (myo->o->x()>=x1 && myo->o->y()>y1 &&
	    myo->o->x()+myo->o->w()<mx && myo->o->y()+myo->o->h()<my) {
	  n++;
	  select(myo, toggle ? !myo->selected : 1);
	}
      CONTINUE:;
      }
      // if nothing in box, select what was clicked on:
      if (!n) {
	select(selection, toggle ? !selection->selected : 1);
      }
    }
    drag = 0;
    ((Overlay_Window *)o)->redraw_overlay();
    return 1;

  case FL_KEYBOARD: {

    int backtab = 0;
    switch (Fl::event_key()) {

    case FL_Escape:
      ((Fl_Window*)o)->hide();
      return 1;

    case FL_Tab: {
      if (Fl::event_state(FL_SHIFT)) backtab = 1;
      // find current child:
      Fl_Type *i = Fl_Type::current;
      while (i && (!i->is_widget() || i->is_menu_item())) i = i->parent;
      if (!i) return 0;
      Fl_Type *p = i->parent;
      while (p && p != this) p = p->parent;
      if (!p || !p->is_widget()) {
	i = next; if (!i || i->level <= level) return 0;
      }
      p = i;
      for (;;) {
	i = backtab ? i->prev : i->next;
	if (!i || i->level <= level) {i = p; break;}
	if (i->is_widget() && !i->is_menu_item()) break;
      }
      deselect(); select(i,1);
      return 1;}

    case FL_Left:  dx = -1; dy = 0; goto ARROW;
    case FL_Right: dx = +1; dy = 0; goto ARROW;
    case FL_Up:    dx = 0; dy = -1; goto ARROW;
    case FL_Down:  dx = 0; dy = +1; goto ARROW;
    ARROW:
      // for some reason BOTTOM/TOP are swapped... should be fixed...
      drag = (Fl::event_state(FL_SHIFT)) ? (RIGHT|TOP) : DRAG;
      if (Fl::event_state(FL_CTRL)) {dx *= gridx; dy *= gridy;}
      moveallchildren();
      drag = 0;
      return 1;

    case 'o':
      toggle_overlays(0, 0);
      break;

    default:
      return 0;
    }}

  case FL_SHORTCUT: {
    in_this_only = this; // modifies how some menu items work.
    const Fl_Menu_Item* m = Main_Menu->test_shortcut();
    if (m && m->callback()) m->do_callback(this->o);
    in_this_only = 0;
    return (m != 0);}

  default:
    return 0;
  }
}